

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O0

bool sptk::ComputePercentagePointOfStandardNormalDistribution
               (double probability,double *percentage_point)

{
  size_type sVar1;
  const_reference pvVar2;
  double *in_RDI;
  double in_XMM0_Qa;
  __type _Var3;
  int i;
  double sum;
  vector<double,_std::allocator<double>_> parameters;
  double y;
  undefined8 in_stack_ffffffffffffff08;
  double __x;
  undefined4 in_stack_ffffffffffffff20;
  int iVar4;
  int local_cc;
  allocator_type *in_stack_ffffffffffffff38;
  double dVar5;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  initializer_list<double> in_stack_ffffffffffffff48;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 *local_48;
  undefined8 local_40;
  vector<double,_std::allocator<double>_> local_38;
  double local_20;
  double *local_18;
  double local_10;
  byte local_1;
  
  if (((in_XMM0_Qa <= 0.0) || (1.0 <= in_XMM0_Qa)) || (in_RDI == (double *)0x0)) {
    local_1 = 0;
  }
  else if ((in_XMM0_Qa != 0.5) || (NAN(in_XMM0_Qa))) {
    local_18 = in_RDI;
    local_10 = in_XMM0_Qa;
    local_20 = log(in_XMM0_Qa * 4.0 * (1.0 - in_XMM0_Qa));
    local_20 = -local_20;
    local_58 = 0x3d68679aa9ec9a38;
    local_68 = 0xbe2bc1390dec58e7;
    uStack_60 = 0x3dc41bd805096df9;
    local_78 = 0xbeb1896bfbd6446e;
    uStack_70 = 0x3e7671979857a092;
    local_88 = 0x3edcb1b3c4588be6;
    uStack_80 = 0x3ed86dba7e177bcb;
    local_98 = 0xbf4b6887417f2c60;
    uStack_90 = 0xbf2d80ece6b44daa;
    local_a8 = 0x3ff921fb49da360e;
    uStack_a0 = 0x3fa2fad2bc7570ab;
    local_48 = &local_a8;
    local_40 = 0xb;
    std::allocator<double>::allocator((allocator<double> *)0x10bfd4);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff38);
    std::allocator<double>::~allocator((allocator<double> *)0x10c002);
    dVar5 = 0.0;
    local_cc = 0;
    while( true ) {
      iVar4 = local_cc;
      sVar1 = std::vector<double,_std::allocator<double>_>::size(&local_38);
      if ((int)sVar1 <= iVar4) break;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_cc);
      __x = *pvVar2;
      _Var3 = std::pow<double,int>(__x,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      dVar5 = __x * _Var3 + dVar5;
      local_cc = local_cc + 1;
    }
    if (local_10 <= 0.5) {
      dVar5 = sqrt(dVar5 * local_20);
    }
    else {
      dVar5 = sqrt(dVar5 * local_20);
      dVar5 = -dVar5;
    }
    *local_18 = dVar5;
    local_1 = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar4,in_stack_ffffffffffffff20))
    ;
  }
  else {
    *in_RDI = 0.0;
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ComputePercentagePointOfStandardNormalDistribution(
    double probability, double* percentage_point) {
  if (probability <= 0.0 || 1.0 <= probability || NULL == percentage_point) {
    return false;
  }

  if (0.5 == probability) {
    *percentage_point = 0.0;
    return true;
  }

  const double y(-std::log(4.0 * probability * (1.0 - probability)));
  const std::vector<double> parameters{
      0.1570796288e+1,  0.3706987906e-1,  -0.8364353589e-3, -0.2250947176e-3,
      0.6841218299e-5,  0.5824238515e-5,  -0.1045274970e-5, 0.8360937017e-7,
      -0.3231081277e-8, 0.3657763036e-10, 0.6936233982e-12};

  double sum(0.0);
  for (int i(0); i < static_cast<int>(parameters.size()); ++i) {
    sum += parameters[i] * std::pow(y, i);
  }
  *percentage_point =
      (0.5 < probability) ? -std::sqrt(sum * y) : std::sqrt(sum * y);
  return true;
}